

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_scalar_fe_space.h
# Opt level: O0

void __thiscall
lf::fe::HierarchicScalarFESpace<double>::
Init<lf::fe::test::lf_fe_DiffusionElementMatrixProviderComplexCoeff_Test::TestBody()::__1>
          (HierarchicScalarFESpace<double> *this,anon_class_8_1_898ec2eb *degree_functor)

{
  span<const_lf::mesh::Orientation,_18446744073709551615UL> rel_orient;
  span<const_lf::mesh::Orientation,_18446744073709551615UL> rel_orient_00;
  array<unsigned_int,_4UL> edge_degrees_00;
  array<unsigned_int,_3UL> edge_degrees_01;
  undefined8 uVar1;
  size_type sVar2;
  uint uVar3;
  bool bVar4;
  RefElType RVar5;
  int iVar6;
  size_type interior_degree;
  size_type sVar7;
  element_type *peVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference ppEVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  reference ppEVar10;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  variant<std::monostate,lf::fe::FePoint<double>,lf::fe::FeHierarchicSegment<double>,lf::fe::FeHierarchicTria<double>,lf::fe::FeHierarchicQuad<double>>
  *pvVar11;
  runtime_error *this_00;
  __extent_storage<18446744073709551615UL> extraout_RDX;
  __extent_storage<18446744073709551615UL> extraout_RDX_00;
  string local_470;
  allocator<char> local_449;
  string local_448;
  allocator<char> local_421;
  string local_420;
  stringstream local_400 [8];
  stringstream ss;
  ostream local_3f0 [376];
  pointer local_278;
  undefined8 local_268;
  undefined8 local_260;
  undefined1 local_258 [8];
  FeHierarchicQuad<double> fe_2;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> local_1e0;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> local_1d0;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> local_1c0;
  size_type local_1b0;
  size_type sStack_1ac;
  array<unsigned_int,_4UL> edge_degrees_1;
  undefined1 local_170 [8];
  FeHierarchicTria<double> fe_1;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> local_118;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> local_108;
  size_type local_f8;
  size_type sStack_f4;
  array<unsigned_int,_3UL> edge_degrees;
  Entity *entity_2;
  iterator __end3_2;
  iterator __begin3_2;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3_2;
  FeHierarchicSegment<double> fe;
  Entity *entity_1;
  iterator __end3_1;
  iterator __begin3_1;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3_1;
  FePoint<double> local_60;
  Entity *local_50;
  Entity *entity;
  iterator __end3;
  iterator __begin3;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3;
  size_type num_rsf_node;
  anon_class_8_1_898ec2eb *degree_functor_local;
  HierarchicScalarFESpace<double> *this_local;
  
  peVar8 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mesh_p_);
  iVar6 = (*peVar8->_vptr_Mesh[2])(peVar8,2);
  __begin3._M_current = (Entity **)CONCAT44(extraout_var,iVar6);
  __end3 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
  entity = (Entity *)
           std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                     ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
  while( true ) {
    bVar4 = __gnu_cxx::
            operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                      (&__end3,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                *)&entity);
    if (((bVar4 ^ 0xffU) & 1) == 0) break;
    ppEVar9 = __gnu_cxx::
              __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
              ::operator*(&__end3);
    local_50 = *ppEVar9;
    FePoint<double>::FePoint(&local_60,1);
    pvVar11 = (variant<std::monostate,lf::fe::FePoint<double>,lf::fe::FeHierarchicSegment<double>,lf::fe::FeHierarchicTria<double>,lf::fe::FeHierarchicQuad<double>>
               *)lf::mesh::utils::
                 AllCodimMeshDataSet<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_>
                 ::operator()(&this->ref_el_,local_50);
    std::
    variant<std::monostate,lf::fe::FePoint<double>,lf::fe::FeHierarchicSegment<double>,lf::fe::FeHierarchicTria<double>,lf::fe::FeHierarchicQuad<double>>
    ::operator=(pvVar11,&local_60);
    FePoint<double>::~FePoint(&local_60);
    __gnu_cxx::
    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
    ::operator++(&__end3);
  }
  peVar8 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mesh_p_);
  iVar6 = (*peVar8->_vptr_Mesh[2])(peVar8,1);
  __begin3_1._M_current = (Entity **)CONCAT44(extraout_var_00,iVar6);
  __end3_1 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3_1);
  entity_1 = (Entity *)
             std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3_1);
  while( true ) {
    bVar4 = __gnu_cxx::
            operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                      (&__end3_1,
                       (__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                        *)&entity_1);
    if (((bVar4 ^ 0xffU) & 1) == 0) break;
    ppEVar9 = __gnu_cxx::
              __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
              ::operator*(&__end3_1);
    fe.qr_dual_ = (QuadRule *)*ppEVar9;
    sVar7 = test::lf_fe_DiffusionElementMatrixProviderComplexCoeff_Test::TestBody::
            anon_class_8_1_898ec2eb::operator()(degree_functor,(Entity *)fe.qr_dual_);
    FeHierarchicSegment<double>::FeHierarchicSegment
              ((FeHierarchicSegment<double> *)&__range3_2,sVar7,&this->qr_cache_);
    pvVar11 = (variant<std::monostate,lf::fe::FePoint<double>,lf::fe::FeHierarchicSegment<double>,lf::fe::FeHierarchicTria<double>,lf::fe::FeHierarchicQuad<double>>
               *)lf::mesh::utils::
                 AllCodimMeshDataSet<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_>
                 ::operator()(&this->ref_el_,(Entity *)fe.qr_dual_);
    std::
    variant<std::monostate,lf::fe::FePoint<double>,lf::fe::FeHierarchicSegment<double>,lf::fe::FeHierarchicTria<double>,lf::fe::FeHierarchicQuad<double>>
    ::operator=(pvVar11,(FeHierarchicSegment<double> *)&__range3_2);
    __gnu_cxx::
    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
    ::operator++(&__end3_1);
  }
  peVar8 = std::__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mesh_p_);
  iVar6 = (*peVar8->_vptr_Mesh[2])(peVar8,0);
  __begin3_2._M_current = (Entity **)CONCAT44(extraout_var_01,iVar6);
  __end3_2 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3_2);
  entity_2 = (Entity *)
             std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                       ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3_2);
  do {
    bVar4 = __gnu_cxx::
            operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                      (&__end3_2,
                       (__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                        *)&entity_2);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      return;
    }
    ppEVar9 = __gnu_cxx::
              __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
              ::operator*(&__end3_2);
    unique0x00012000 = *ppEVar9;
    iVar6 = (*unique0x00012000->_vptr_Entity[4])();
    edge_degrees._M_elems[1]._3_1_ = (undefined1)iVar6;
    RVar5 = lf::base::RefEl::operator_cast_to_RefElType((RefEl *)((long)edge_degrees._M_elems + 7));
    if (RVar5 == kTria) {
      iVar6 = (*stack0xffffffffffffff18->_vptr_Entity[1])(stack0xffffffffffffff18,1);
      local_108._M_ptr = (pointer)CONCAT44(extraout_var_02,iVar6);
      ppEVar10 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                           (&local_108,0);
      local_f8 = test::lf_fe_DiffusionElementMatrixProviderComplexCoeff_Test::TestBody::
                 anon_class_8_1_898ec2eb::operator()(degree_functor,*ppEVar10);
      iVar6 = (*stack0xffffffffffffff18->_vptr_Entity[1])(stack0xffffffffffffff18,1);
      local_118._M_ptr = (pointer)CONCAT44(extraout_var_03,iVar6);
      ppEVar10 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                           (&local_118,1);
      sStack_f4 = test::lf_fe_DiffusionElementMatrixProviderComplexCoeff_Test::TestBody::
                  anon_class_8_1_898ec2eb::operator()(degree_functor,*ppEVar10);
      iVar6 = (*stack0xffffffffffffff18->_vptr_Entity[1])(stack0xffffffffffffff18,1);
      fe_1.rel_orient_._M_extent._M_extent_value = CONCAT44(extraout_var_04,iVar6);
      ppEVar10 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                           ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                            &fe_1.rel_orient_._M_extent,2);
      edge_degrees._M_elems[0] =
           test::lf_fe_DiffusionElementMatrixProviderComplexCoeff_Test::TestBody::
           anon_class_8_1_898ec2eb::operator()(degree_functor,*ppEVar10);
      interior_degree =
           test::lf_fe_DiffusionElementMatrixProviderComplexCoeff_Test::TestBody::
           anon_class_8_1_898ec2eb::operator()(degree_functor,stack0xffffffffffffff18);
      uVar3 = edge_degrees._M_elems[0];
      sVar2 = sStack_f4;
      sVar7 = local_f8;
      uVar1._4_4_ = sStack_f4;
      uVar1._0_4_ = local_f8;
      iVar6 = (*stack0xffffffffffffff18->_vptr_Entity[2])();
      rel_orient._M_ptr._4_4_ = extraout_var_05;
      rel_orient._M_ptr._0_4_ = iVar6;
      edge_degrees_01._M_elems[2] = uVar3;
      edge_degrees_01._M_elems[0] = sVar7;
      edge_degrees_01._M_elems[1] = sVar2;
      rel_orient._M_extent._M_extent_value = extraout_RDX._M_extent_value;
      edge_degrees_1._M_elems._8_8_ = uVar1;
      FeHierarchicTria<double>::FeHierarchicTria
                ((FeHierarchicTria<double> *)local_170,interior_degree,edge_degrees_01,
                 &this->qr_cache_,rel_orient);
      pvVar11 = (variant<std::monostate,lf::fe::FePoint<double>,lf::fe::FeHierarchicSegment<double>,lf::fe::FeHierarchicTria<double>,lf::fe::FeHierarchicQuad<double>>
                 *)lf::mesh::utils::
                   AllCodimMeshDataSet<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_>
                   ::operator()(&this->ref_el_,stack0xffffffffffffff18);
      std::
      variant<std::monostate,lf::fe::FePoint<double>,lf::fe::FeHierarchicSegment<double>,lf::fe::FeHierarchicTria<double>,lf::fe::FeHierarchicQuad<double>>
      ::operator=(pvVar11,(FeHierarchicTria<double> *)local_170);
    }
    else {
      if (RVar5 != kQuad) {
        std::__cxx11::stringstream::stringstream(local_400);
        std::operator<<(local_3f0,"Illegal entity type");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,"false",&local_421);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_448,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/hierarchic_scalar_fe_space.h"
                   ,&local_449);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_420,&local_448,0xd9,&local_470);
        std::__cxx11::string::~string((string *)&local_470);
        std::__cxx11::string::~string((string *)&local_448);
        std::allocator<char>::~allocator(&local_449);
        std::__cxx11::string::~string((string *)&local_420);
        std::allocator<char>::~allocator(&local_421);
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"this code should not be reached");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar6 = (*stack0xffffffffffffff18->_vptr_Entity[1])(stack0xffffffffffffff18,1);
      local_1c0._M_ptr = (pointer)CONCAT44(extraout_var_06,iVar6);
      ppEVar10 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                           (&local_1c0,0);
      local_1b0 = test::lf_fe_DiffusionElementMatrixProviderComplexCoeff_Test::TestBody::
                  anon_class_8_1_898ec2eb::operator()(degree_functor,*ppEVar10);
      iVar6 = (*stack0xffffffffffffff18->_vptr_Entity[1])(stack0xffffffffffffff18,1);
      local_1d0._M_ptr = (pointer)CONCAT44(extraout_var_07,iVar6);
      ppEVar10 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                           (&local_1d0,1);
      sStack_1ac = test::lf_fe_DiffusionElementMatrixProviderComplexCoeff_Test::TestBody::
                   anon_class_8_1_898ec2eb::operator()(degree_functor,*ppEVar10);
      iVar6 = (*stack0xffffffffffffff18->_vptr_Entity[1])(stack0xffffffffffffff18,1);
      local_1e0._M_ptr = (pointer)CONCAT44(extraout_var_08,iVar6);
      ppEVar10 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                           (&local_1e0,2);
      edge_degrees_1._M_elems[0] =
           test::lf_fe_DiffusionElementMatrixProviderComplexCoeff_Test::TestBody::
           anon_class_8_1_898ec2eb::operator()(degree_functor,*ppEVar10);
      iVar6 = (*stack0xffffffffffffff18->_vptr_Entity[1])(stack0xffffffffffffff18,1);
      fe_2.rel_orient_._M_extent._M_extent_value = CONCAT44(extraout_var_09,iVar6);
      ppEVar10 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::operator[]
                           ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)
                            &fe_2.rel_orient_._M_extent,3);
      edge_degrees_1._M_elems[1] =
           test::lf_fe_DiffusionElementMatrixProviderComplexCoeff_Test::TestBody::
           anon_class_8_1_898ec2eb::operator()(degree_functor,*ppEVar10);
      sVar7 = test::lf_fe_DiffusionElementMatrixProviderComplexCoeff_Test::TestBody::
              anon_class_8_1_898ec2eb::operator()(degree_functor,stack0xffffffffffffff18);
      local_268 = CONCAT44(sStack_1ac,local_1b0);
      local_260 = CONCAT44(edge_degrees_1._M_elems[1],edge_degrees_1._M_elems[0]);
      iVar6 = (*stack0xffffffffffffff18->_vptr_Entity[2])();
      local_278 = (pointer)CONCAT44(extraout_var_10,iVar6);
      edge_degrees_00._M_elems[2] = (undefined4)local_260;
      edge_degrees_00._M_elems[3] = local_260._4_4_;
      edge_degrees_00._M_elems[0] = (undefined4)local_268;
      edge_degrees_00._M_elems[1] = local_268._4_4_;
      rel_orient_00._M_extent._M_extent_value = extraout_RDX_00._M_extent_value;
      rel_orient_00._M_ptr = local_278;
      FeHierarchicQuad<double>::FeHierarchicQuad
                ((FeHierarchicQuad<double> *)local_258,sVar7,edge_degrees_00,&this->qr_cache_,
                 rel_orient_00);
      pvVar11 = (variant<std::monostate,lf::fe::FePoint<double>,lf::fe::FeHierarchicSegment<double>,lf::fe::FeHierarchicTria<double>,lf::fe::FeHierarchicQuad<double>>
                 *)lf::mesh::utils::
                   AllCodimMeshDataSet<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_>
                   ::operator()(&this->ref_el_,stack0xffffffffffffff18);
      std::
      variant<std::monostate,lf::fe::FePoint<double>,lf::fe::FeHierarchicSegment<double>,lf::fe::FeHierarchicTria<double>,lf::fe::FeHierarchicQuad<double>>
      ::operator=(pvVar11,(FeHierarchicQuad<double> *)local_258);
    }
    __gnu_cxx::
    __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
    ::operator++(&__end3_2);
  } while( true );
}

Assistant:

void Init(F &&degree_functor) {
    // Initialize all shape function layouts for nodes
    const size_type num_rsf_node = 1;
    for (const auto *entity : mesh_p_->Entities(2)) {
      ref_el_(*entity) = FePoint<SCALAR>(1);
    }
    // Initialize all shape function layouts for the edges
    for (const auto *entity : mesh_p_->Entities(1)) {
      FeHierarchicSegment<SCALAR> fe(degree_functor(*entity), qr_cache_);

      ref_el_(*entity) = std::move(fe);
    }
    // Initialize all shape function layouts for the cells
    for (const auto *entity : mesh_p_->Entities(0)) {
      switch (entity->RefEl()) {
        case lf::base::RefEl::kTria(): {
          const std::array<unsigned, 3> edge_degrees{
              {degree_functor(*entity->SubEntities(1)[0]),
               degree_functor(*entity->SubEntities(1)[1]),
               degree_functor(*entity->SubEntities(1)[2])}};
          FeHierarchicTria<SCALAR> fe(degree_functor(*entity), edge_degrees,
                                      qr_cache_,
                                      entity->RelativeOrientations());
          ref_el_(*entity) = std::move(fe);
          break;
        }
        case lf::base::RefEl::kQuad(): {
          const std::array<unsigned, 4> edge_degrees{
              {degree_functor(*entity->SubEntities(1)[0]),
               degree_functor(*entity->SubEntities(1)[1]),
               degree_functor(*entity->SubEntities(1)[2]),
               degree_functor(*entity->SubEntities(1)[3])}};
          FeHierarchicQuad<SCALAR> fe(degree_functor(*entity), edge_degrees,
                                      qr_cache_,
                                      entity->RelativeOrientations());
          ref_el_(*entity) = std::move(fe);
          break;
        }
        default:
          LF_VERIFY_MSG(false, "Illegal entity type");
      }
    }
  }